

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

void __thiscall imrt::ApertureILS::ApertureILS(ApertureILS *this,ApertureILS *ils)

{
  int iVar1;
  ILS *in_RSI;
  ILS *in_RDI;
  
  ILS::ILS(in_RDI,in_RSI);
  in_RDI->_vptr_ILS = (_func_int **)&PTR__ApertureILS_0019bc48;
  std::__cxx11::
  list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>::list
            ((list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
              *)0x16ad2c);
  in_RDI->field_0x24 = in_RSI->field_0x24 & 1;
  in_RDI->field_0x25 = in_RSI->field_0x25 & 1;
  in_RDI[1]._vptr_ILS = in_RSI[1]._vptr_ILS;
  *(undefined4 *)&in_RDI[1].max_no_improvement = *(undefined4 *)&in_RSI[1].max_no_improvement;
  iVar1 = in_RSI[1].vsize;
  in_RDI[1].bsize = in_RSI[1].bsize;
  in_RDI[1].vsize = iVar1;
  in_RDI[2]._vptr_ILS = in_RSI[2]._vptr_ILS;
  *(byte *)((long)&in_RDI[2].max_no_improvement + 4) =
       *(byte *)((long)&in_RSI[2].max_no_improvement + 4) & 1;
  *(undefined4 *)&in_RDI[2].max_no_improvement = *(undefined4 *)&in_RSI[2].max_no_improvement;
  *(undefined4 *)((long)&in_RDI[1].max_no_improvement + 4) =
       *(undefined4 *)((long)&in_RSI[1].max_no_improvement + 4);
  in_RDI[1].time_begin = in_RSI[1].time_begin;
  return;
}

Assistant:

ApertureILS::ApertureILS(const ApertureILS & ils): ILS(ils) {
  search_intensity=ils.search_intensity;
  search_aperture=ils.search_aperture;
  prob_intensity=ils.prob_intensity;
  step_intensity=ils.step_intensity;
  initial_temperature=ils.initial_temperature;
  alpha=ils.alpha;
  do_perturbate=ils.do_perturbate;
  perturbation_size=ils.perturbation_size;
  ls_type=ils.ls_type;
  temperature=ils.temperature;
}